

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,int type)

{
  int in_EDX;
  undefined4 in_register_00000034;
  _func_int *p_Var1;
  long *local_40 [2];
  long local_30 [2];
  
  (**(code **)(*(long *)(*(long *)(CONCAT44(in_register_00000034,type) + 0x18) + (long)in_EDX * 8) +
              8))();
  if (this->_vptr_ASTFactory == (_func_int **)0x0) {
    p_Var1 = (_func_int *)0x0;
  }
  else {
    p_Var1 = *this->_vptr_ASTFactory;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  (**(code **)(*(long *)p_Var1 + 0x88))(p_Var1,in_EDX,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::create(int type)
{
	RefAST t = nodeFactories[type]->second();
	t->initialize(type,"");
	return t;
}